

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O0

char * Qiniu_CDN_CreateTimestampAntiLeechURL
                 (char *host,char *fileName,char *queryStr,Qiniu_Uint64 deadline,char *cryptKey)

{
  int iVar1;
  char *s2;
  char *addr;
  char *src;
  char *addr_00;
  char *sign;
  char *signStr;
  char *path;
  char expireHex [20];
  char *queryStrEscaped;
  char *fileNameEscaped;
  Qiniu_Bool queryStrEscapeOk;
  Qiniu_Bool fileNameEscapeOk;
  char *finalURL;
  char *cryptKey_local;
  Qiniu_Uint64 deadline_local;
  char *queryStr_local;
  char *fileName_local;
  char *host_local;
  
  _queryStrEscapeOk = (char *)0x0;
  fileNameEscaped._4_4_ = 0;
  fileNameEscaped._0_4_ = 0;
  finalURL = cryptKey;
  cryptKey_local = (char *)deadline;
  deadline_local = (Qiniu_Uint64)queryStr;
  queryStr_local = fileName;
  fileName_local = host;
  s2 = Qiniu_PathEscape(fileName,(Qiniu_Bool *)((long)&fileNameEscaped + 4));
  stack0xffffffffffffffb0 = (char *)0x0;
  snprintf((char *)&path,0x14,"%0llx",cryptKey_local);
  if (deadline_local != 0) {
    iVar1 = strcmp("",(char *)deadline_local);
    if (iVar1 != 0) {
      register0x00000000 = Qiniu_PathEscape((char *)deadline_local,(Qiniu_Bool *)&fileNameEscaped);
    }
  }
  addr = Qiniu_String_Concat2("/",s2);
  src = Qiniu_String_Concat(finalURL,addr,&path,0);
  addr_00 = Qiniu_MD5_HexStr(src);
  if (stack0xffffffffffffffb0 == (char *)0x0) {
    _queryStrEscapeOk = Qiniu_String_Concat(fileName_local,addr,"?sign=",addr_00,"&t=",&path,0);
  }
  else {
    _queryStrEscapeOk =
         Qiniu_String_Concat(fileName_local,addr,"?",stack0xffffffffffffffb0,"&sign=",addr_00,"&t=",
                             &path,0);
  }
  if (fileNameEscaped._4_4_ == 1) {
    Qiniu_Free(s2);
  }
  if ((int)fileNameEscaped == 1) {
    Qiniu_Free(stack0xffffffffffffffb0);
  }
  Qiniu_Free(addr);
  Qiniu_Free(src);
  Qiniu_Free(addr_00);
  return _queryStrEscapeOk;
}

Assistant:

char *Qiniu_CDN_CreateTimestampAntiLeechURL(const char *host, const char *fileName, char *queryStr,
                                            Qiniu_Uint64 deadline, const char *cryptKey) {
    char *finalURL = NULL;
    Qiniu_Bool fileNameEscapeOk = Qiniu_False;
    Qiniu_Bool queryStrEscapeOk = Qiniu_False;
    char *fileNameEscaped = Qiniu_PathEscape(fileName, &fileNameEscapeOk);
    char *queryStrEscaped = NULL;

    char expireHex[20];
    snprintf(expireHex, 20, "%0llx", deadline);

    if (queryStr != NULL && strcmp("", queryStr) != 0) {
        queryStrEscaped = Qiniu_PathEscape(queryStr, &queryStrEscapeOk);
    }

    char *path = Qiniu_String_Concat2("/", fileNameEscaped);
    char *signStr = Qiniu_String_Concat(cryptKey, path, expireHex, NULL);
    char *sign = (char *) Qiniu_MD5_HexStr(signStr);

    if (queryStrEscaped != NULL) {
        finalURL = Qiniu_String_Concat(host, path, "?", queryStrEscaped, "&sign=", sign, "&t=", expireHex, NULL);
    } else {
        finalURL = Qiniu_String_Concat(host, path, "?sign=", sign, "&t=", expireHex, NULL);
    }

    if (fileNameEscapeOk == Qiniu_True) {
        Qiniu_Free(fileNameEscaped);
    }
    if (queryStrEscapeOk == Qiniu_True) {
        Qiniu_Free(queryStrEscaped);
    }
    Qiniu_Free(path);
    Qiniu_Free(signStr);
    Qiniu_Free(sign);
    return finalURL;
}